

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_378fef::SQLiteBuildDB::setRuleResult
          (SQLiteBuildDB *this,KeyID keyID,Rule *rule,Result *ruleResult,string *error_out)

{
  sqlite3_stmt *psVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  DBKeyID DVar5;
  ulong uVar6;
  uchar *puVar7;
  size_type sVar8;
  uint8_t *puVar9;
  size_t sVar10;
  Result *__n;
  int __oflag;
  undefined1 auVar11 [16];
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  uint64_t local_1c0;
  uint64_t local_1b8;
  DBKeyID dbKeyID_1;
  undefined2 local_1a8;
  KeyIDAndFlags dependency;
  const_iterator __end2;
  const_iterator __begin2;
  DependencyKeyIDs *__range2;
  BinaryEncoder encoder;
  DBKeyID dbKeyID;
  int result;
  lock_guard<std::mutex> guard;
  string *error_out_local;
  Result *ruleResult_local;
  Rule *rule_local;
  SQLiteBuildDB *this_local;
  KeyID keyID_local;
  
  guard._M_device = (mutex_type *)error_out;
  if (this->delegate == (BuildDBDelegate *)0x0) {
    __assert_fail("delegate != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x25d,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::setRuleResult(KeyID, const Rule &, const Result &, std::string *)"
                 );
  }
  __n = ruleResult;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffc0,&this->dbMutex);
  uVar3 = open(this,(char *)guard._M_device,__oflag);
  if ((uVar3 & 1) == 0) {
    keyID_local._value._7_1_ = false;
  }
  else {
    encoder.encdata.super_SmallVectorStorage<unsigned_char,_256U>.InlineElts._248_8_ = keyID._value;
    DVar5 = getKeyID(this,keyID,(string *)guard._M_device);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      keyID_local._value._7_1_ = false;
    }
    else {
      llbuild::basic::BinaryEncoder::BinaryEncoder((BinaryEncoder *)&__range2);
      join_0x00000010_0x00000000_ =
           llbuild::core::DependencyKeyIDs::begin(&ruleResult->dependencies);
      join_0x00000010_0x00000000_ = llbuild::core::DependencyKeyIDs::end(&ruleResult->dependencies);
      while( true ) {
        bVar2 = llbuild::core::DependencyKeyIDs::const_iterator::operator!=
                          ((const_iterator *)&__end2.index,(const_iterator *)&dependency.orderOnly);
        if (!bVar2) break;
        _dbKeyID_1 = llbuild::core::DependencyKeyIDs::const_iterator::operator*
                               ((const_iterator *)&__end2.index);
        dependency.keyID._value._0_2_ = local_1a8;
        local_1c0 = dbKeyID_1.value;
        local_1b8 = (uint64_t)getKeyID(this,dbKeyID_1.value,(string *)guard._M_device);
        auVar11 = std::__cxx11::string::empty();
        if ((auVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          keyID_local._value._7_1_ = false;
          goto LAB_002fdfbd;
        }
        llbuild::basic::BinaryEncoder::write
                  ((BinaryEncoder *)&__range2,
                   (int)(local_1b8 << 2) + (uint)(dependency.keyID._value._1_1_ & 1) * 2 +
                   (uint)((byte)dependency.keyID._value & 1),auVar11._8_8_,(size_t)__n);
        llbuild::core::DependencyKeyIDs::const_iterator::operator++((const_iterator *)&__end2.index)
        ;
      }
      iVar4 = sqlite3_reset(this->insertIntoRuleResultsStmt);
      if (iVar4 == 0) {
        iVar4 = sqlite3_clear_bindings(this->insertIntoRuleResultsStmt);
        if (iVar4 == 0) {
          iVar4 = sqlite3_bind_int64(this->insertIntoRuleResultsStmt,1,DVar5.value);
          if (iVar4 == 0) {
            psVar1 = this->insertIntoRuleResultsStmt;
            puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               (&ruleResult->value);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              (&ruleResult->value);
            iVar4 = sqlite3_bind_blob(psVar1,2,puVar7,sVar8 & 0xffffffff,0);
            if (iVar4 == 0) {
              iVar4 = sqlite3_bind_int64(this->insertIntoRuleResultsStmt,3,
                                         (ruleResult->signature).value);
              if (iVar4 == 0) {
                iVar4 = sqlite3_bind_int64(this->insertIntoRuleResultsStmt,4,ruleResult->builtAt);
                if (iVar4 == 0) {
                  iVar4 = sqlite3_bind_int64(this->insertIntoRuleResultsStmt,5,
                                             ruleResult->computedAt);
                  if (iVar4 == 0) {
                    iVar4 = sqlite3_bind_double(ruleResult->start,this->insertIntoRuleResultsStmt,6)
                    ;
                    if (iVar4 == 0) {
                      iVar4 = sqlite3_bind_double(ruleResult->end,this->insertIntoRuleResultsStmt,7)
                      ;
                      if (iVar4 == 0) {
                        psVar1 = this->insertIntoRuleResultsStmt;
                        puVar9 = llbuild::basic::BinaryEncoder::data((BinaryEncoder *)&__range2);
                        sVar10 = llbuild::basic::BinaryEncoder::size((BinaryEncoder *)&__range2);
                        iVar4 = sqlite3_bind_blob(psVar1,8,puVar9,sVar10 & 0xffffffff,0);
                        if (iVar4 == 0) {
                          iVar4 = sqlite3_step(this->insertIntoRuleResultsStmt);
                          if (iVar4 == 0x65) {
                            keyID_local._value._7_1_ = true;
                          }
                          else {
                            (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                                      (&local_320,this);
                            std::__cxx11::string::operator=
                                      ((string *)guard._M_device,(string *)&local_320);
                            std::__cxx11::string::~string((string *)&local_320);
                            keyID_local._value._7_1_ = false;
                          }
                        }
                        else {
                          (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                                    (&local_300,this);
                          std::__cxx11::string::operator=
                                    ((string *)guard._M_device,(string *)&local_300);
                          std::__cxx11::string::~string((string *)&local_300);
                          keyID_local._value._7_1_ = false;
                        }
                      }
                      else {
                        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                                  (&local_2e0,this);
                        std::__cxx11::string::operator=
                                  ((string *)guard._M_device,(string *)&local_2e0);
                        std::__cxx11::string::~string((string *)&local_2e0);
                        keyID_local._value._7_1_ = false;
                      }
                    }
                    else {
                      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                                (&local_2c0,this);
                      std::__cxx11::string::operator=
                                ((string *)guard._M_device,(string *)&local_2c0);
                      std::__cxx11::string::~string((string *)&local_2c0);
                      keyID_local._value._7_1_ = false;
                    }
                  }
                  else {
                    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                              (&local_2a0,this);
                    std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_2a0);
                    std::__cxx11::string::~string((string *)&local_2a0);
                    keyID_local._value._7_1_ = false;
                  }
                }
                else {
                  (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                            (&local_280,this);
                  std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_280);
                  std::__cxx11::string::~string((string *)&local_280);
                  keyID_local._value._7_1_ = false;
                }
              }
              else {
                (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                          (&local_260,this);
                std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_260);
                std::__cxx11::string::~string((string *)&local_260);
                keyID_local._value._7_1_ = false;
              }
            }
            else {
              (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                        (&local_240,this);
              std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_240);
              std::__cxx11::string::~string((string *)&local_240);
              keyID_local._value._7_1_ = false;
            }
          }
          else {
            (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_220,this)
            ;
            std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            keyID_local._value._7_1_ = false;
          }
        }
        else {
          (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_200,this);
          std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          keyID_local._value._7_1_ = false;
        }
      }
      else {
        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_1e0,this);
        std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        keyID_local._value._7_1_ = false;
      }
LAB_002fdfbd:
      llbuild::basic::BinaryEncoder::~BinaryEncoder((BinaryEncoder *)&__range2);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffc0);
  return keyID_local._value._7_1_;
}

Assistant:

virtual bool setRuleResult(KeyID keyID,
                             const Rule& rule,
                             const Result& ruleResult,
                             std::string *error_out) override {
    assert(delegate != nullptr);
    std::lock_guard<std::mutex> guard(dbMutex);
    int result;

    if (!open(error_out)) {
      return false;
    }

    auto dbKeyID = getKeyID(keyID, error_out);
    if (!error_out->empty()) {
      return false;
    }

    // Create the encoded dependency list.
    //
    // FIXME: We could save some reallocation by having a templated SmallVector
    // size here.
    basic::BinaryEncoder encoder{};
    for (auto dependency: ruleResult.dependencies) {
      // Map the enging keyID to a database key ID
      //
      // FIXME: This is naively mapping all keys with no caching at this point,
      // thus likely to perform poorly.  Should refactor this into a bulk
      // query or a DB layer cache.
      auto dbKeyID = getKeyID(dependency.keyID, error_out);
      if (!error_out->empty()) {
        return false;
      }
      encoder.write((dbKeyID.value << 2) + (dependency.singleUse << 1) + dependency.orderOnly);
    }

    // Insert the actual rule result.
    result = sqlite3_reset(insertIntoRuleResultsStmt);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_clear_bindings(insertIntoRuleResultsStmt);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(insertIntoRuleResultsStmt, /*index=*/1,
                               dbKeyID.value);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_blob(insertIntoRuleResultsStmt, /*index=*/2,
                               ruleResult.value.data(),
                               ruleResult.value.size(),
                               SQLITE_STATIC);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(insertIntoRuleResultsStmt, /*index=*/3,
                               ruleResult.signature.value);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(insertIntoRuleResultsStmt, /*index=*/4,
                                ruleResult.builtAt);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(insertIntoRuleResultsStmt, /*index=*/5,
                                ruleResult.computedAt);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_double(insertIntoRuleResultsStmt, /*index=*/6,
                                ruleResult.start);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_double(insertIntoRuleResultsStmt, /*index=*/7,
                                ruleResult.end);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_blob(insertIntoRuleResultsStmt, /*index=*/8,
                               encoder.data(),
                               encoder.size(),
                               SQLITE_STATIC);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_step(insertIntoRuleResultsStmt);
    if (result != SQLITE_DONE) {
      *error_out = getCurrentErrorMessage();
      return false;
    }

    return true;
  }